

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.hpp
# Opt level: O0

bool pstore::command_line::details::parse_positional_arguments<char*const*>
               (char **first_arg,char **last_arg)

{
  char *pcVar1;
  option *poVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  options_container *__cont;
  reference ppoVar6;
  _Self *p_Var7;
  bool local_b2;
  allocator local_81;
  string local_80 [32];
  option *local_60;
  option *handler;
  _List_node_base *local_50;
  _List_node_base *local_48;
  _Self local_40;
  _List_const_iterator<pstore::command_line::option_*> it;
  const_iterator end;
  anon_class_1_0_00000001_for__M_pred is_positional;
  options_container *all_options;
  bool ok;
  char **last_arg_local;
  char **first_arg_local;
  
  all_options._7_1_ = 1;
  __cont = option::all_abi_cxx11_();
  it._M_node = (_List_node_base *)
               std::
               end<std::__cxx11::list<pstore::command_line::option*,std::allocator<pstore::command_line::option*>>>
                         (__cont);
  local_48 = (_List_node_base *)
             std::
             begin<std::__cxx11::list<pstore::command_line::option*,std::allocator<pstore::command_line::option*>>>
                       (__cont);
  local_50 = it._M_node;
  local_40._M_node =
       (_List_node_base *)
       std::
       find_if<std::_List_const_iterator<pstore::command_line::option*>,pstore::command_line::details::parse_positional_arguments<char*const*>(char*const*,char*const*)::_lambda(pstore::command_line::option_const*)_1_>
                 (local_48,it._M_node);
  last_arg_local = first_arg;
  while( true ) {
    local_b2 = false;
    if (last_arg_local != last_arg) {
      local_b2 = std::operator!=(&local_40,&it);
    }
    if (local_b2 == false) break;
    ppoVar6 = std::_List_const_iterator<pstore::command_line::option_*>::operator*(&local_40);
    local_60 = *ppoVar6;
    uVar4 = (*local_60->_vptr_option[9])();
    if ((uVar4 & 1) == 0) {
      assert_failed("handler->is_positional ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/command_line/command_line.hpp"
                    ,300);
    }
    iVar5 = (*local_60->_vptr_option[0x10])();
    poVar2 = local_60;
    all_options._7_1_ = (byte)iVar5;
    pcVar1 = *last_arg_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,pcVar1,&local_81);
    iVar5 = (*poVar2->_vptr_option[0xf])(poVar2,local_80);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    if ((((byte)iVar5 ^ 0xff) & 1) != 0) {
      all_options._7_1_ = 0;
    }
    bVar3 = option::can_accept_another_occurrence(local_60);
    if (!bVar3) {
      p_Var7 = std::_List_const_iterator<pstore::command_line::option_*>::operator++(&local_40);
      local_40._M_node =
           (_List_node_base *)
           std::
           find_if<std::_List_const_iterator<pstore::command_line::option*>,pstore::command_line::details::parse_positional_arguments<char*const*>(char*const*,char*const*)::_lambda(pstore::command_line::option_const*)_1_>
                     (p_Var7->_M_node,it._M_node);
    }
    last_arg_local = last_arg_local + 1;
  }
  return (bool)(all_options._7_1_ & 1);
}

Assistant:

bool parse_positional_arguments (InputIterator first_arg, InputIterator last_arg) {
                bool ok = true;

                auto const & all_options = option::all ();
                auto const is_positional = [] (option const * const opt) {
                    return opt->is_positional ();
                };

                auto end = std::end (all_options);
                auto it = std::find_if (std::begin (all_options), end, is_positional);
                for (; first_arg != last_arg && it != end; ++first_arg) {
                    option * const handler = *it;
                    PSTORE_ASSERT (handler->is_positional ());
                    ok = handler->add_occurrence ();
                    if (!handler->value (*first_arg)) {
                        ok = false;
                    }
                    if (!handler->can_accept_another_occurrence ()) {
                        it = std::find_if (++it, end, is_positional);
                    }
                }
                return ok;
            }